

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipartExamples.cpp
# Opt level: O1

void insertSlice<float>(Box2i *dataWindow,FrameBuffer *frameBuffer,char *name,PixelType pixelType,
                       list<Imf_3_4::Array2D<float>,_std::allocator<Imf_3_4::Array2D<float>_>_>
                       *channels)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  long lVar4;
  int iVar5;
  int iVar6;
  Slice local_68 [56];
  
  iVar5 = ((dataWindow->max).x - (dataWindow->min).x) + 1;
  iVar6 = ((dataWindow->max).y - (dataWindow->min).y) + 1;
  p_Var2 = (_List_node_base *)operator_new(0x28);
  p_Var2[1]._M_next = (_List_node_base *)0x0;
  p_Var2[1]._M_prev = (_List_node_base *)0x0;
  p_Var2[2]._M_next = (_List_node_base *)0x0;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  psVar1 = &(channels->
            super__List_base<Imf_3_4::Array2D<float>,_std::allocator<Imf_3_4::Array2D<float>_>_>).
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  p_Var2 = (channels->
           super__List_base<Imf_3_4::Array2D<float>,_std::allocator<Imf_3_4::Array2D<float>_>_>).
           _M_impl._M_node.super__List_node_base._M_prev;
  lVar4 = (long)iVar5;
  p_Var3 = (_List_node_base *)
           operator_new__(-(ulong)((ulong)(iVar6 * lVar4) >> 0x3e != 0) | iVar6 * lVar4 * 4);
  if (p_Var2[2]._M_next != (_List_node_base *)0x0) {
    operator_delete__(p_Var2[2]._M_next);
  }
  *(int *)&p_Var2[1]._M_next = iVar6;
  *(uint *)((long)&p_Var2[1]._M_next + 4) = -(uint)(iVar6 < 0);
  *(int *)&p_Var2[1]._M_prev = iVar5;
  *(uint *)((long)&p_Var2[1]._M_prev + 4) = -(uint)(iVar5 < 0);
  p_Var2[2]._M_next = p_Var3;
  Imf_3_4::Slice::Slice
            (local_68,pixelType,
             (char *)((long)p_Var3 +
                     (dataWindow->min).y * lVar4 * -4 + (long)(dataWindow->min).x * -4),4,lVar4 << 2
             ,1,1,0.0,false,false);
  Imf_3_4::FrameBuffer::insert((char *)frameBuffer,(Slice *)name);
  return;
}

Assistant:

void
insertSlice (
    Box2i&                    dataWindow,
    FrameBuffer&              frameBuffer,
    const char                name[],
    PixelType                 pixelType,
    list<Array2D<ValueType>>& channels)
{
    //
    // Allocate a pixel buffer and describe the layout of
    // the buffer in the FrameBuffer object.
    //

    size_t width  = dataWindow.max.x - dataWindow.min.x + 1;
    size_t height = dataWindow.max.y - dataWindow.min.y + 1;

    channels.emplace_back ();
    Array2D<ValueType>& buffer = channels.back ();
    buffer.resizeErase (height, width);

    char* base =
        (char*) (&buffer[0][0] - dataWindow.min.x - dataWindow.min.y * width);

    frameBuffer.insert (
        name, // name
        Slice (
            pixelType,                 // type
            base,                      // base
            sizeof (ValueType) * 1,    // xStride
            sizeof (ValueType) * width // yStride
            ));
}